

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norms.cpp
# Opt level: O2

Norm * __thiscall icu_63::Norms::createNorm(Norms *this,UChar32 c)

{
  uint32_t uVar1;
  Norm *pNVar2;
  IcuToolErrorCode errorCode;
  IcuToolErrorCode local_30;
  
  uVar1 = umutablecptrie_get_63(this->normTrie,c);
  if (uVar1 == 0) {
    pNVar2 = allocNorm(this);
    local_30.super_ErrorCode.errorCode = U_ZERO_ERROR;
    local_30.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_0039ffb8;
    local_30.location = "gennorm2/createNorm()";
    umutablecptrie_set_63
              (this->normTrie,c,(uint32_t)((ulong)((long)pNVar2 - (long)this->norms) >> 6),
               &local_30.super_ErrorCode.errorCode);
    IcuToolErrorCode::~IcuToolErrorCode(&local_30);
  }
  else {
    pNVar2 = this->norms + uVar1;
  }
  return pNVar2;
}

Assistant:

Norm *Norms::createNorm(UChar32 c) {
    uint32_t i=umutablecptrie_get(normTrie, c);
    if(i!=0) {
        return norms+i;
    } else {
        /* allocate Norm */
        Norm *p=allocNorm();
        IcuToolErrorCode errorCode("gennorm2/createNorm()");
        umutablecptrie_set(normTrie, c, (uint32_t)(p - norms), errorCode);
        return p;
    }
}